

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O3

SoapySDRRange *
SoapySDRDevice_getFrequencyRangeComponent
          (SoapySDRDevice *device,int direction,size_t channel,char *name,size_t *length)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  SoapySDRRange *pSVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  allocator local_71;
  undefined1 *local_70;
  void *local_68;
  void *local_60;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  *length = 0;
  local_70 = (undefined1 *)__tls_get_addr(&PTR_0014ce88);
  *local_70 = 0;
  *(undefined4 *)(local_70 + 0x400) = 0;
  std::__cxx11::string::string((string *)local_50,name,&local_71);
  (**(code **)(*(long *)device + 0x1e8))(&local_68,device,direction,channel,local_50);
  pSVar5 = callocArrayType<SoapySDRRange>
                     (((long)local_60 - (long)local_68 >> 3) * -0x5555555555555555);
  sVar6 = ((long)local_60 - (long)local_68 >> 3) * -0x5555555555555555;
  if (local_60 == local_68) {
    *length = sVar6;
    if (local_60 == (void *)0x0) goto LAB_001305e2;
  }
  else {
    lVar7 = sVar6 + (sVar6 == 0);
    lVar8 = 0x10;
    do {
      uVar3 = *(undefined8 *)((long)local_68 + lVar8);
      puVar1 = (undefined8 *)((long)local_68 + lVar8 + -0x10);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)pSVar5 + lVar8 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      *(undefined8 *)((long)&pSVar5->minimum + lVar8) = uVar3;
      lVar8 = lVar8 + 0x18;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    *length = sVar6;
  }
  operator_delete(local_68);
LAB_001305e2:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return pSVar5;
}

Assistant:

SoapySDRRange *SoapySDRDevice_getFrequencyRangeComponent(const SoapySDRDevice *device, const int direction, const size_t channel, const char *name, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toRangeList(device->getFrequencyRange(direction, channel, name), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}